

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

size_t quantize_q2_K(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  byte bVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  int j;
  size_t sVar9;
  long lVar10;
  float *pfVar11;
  float *pfVar12;
  undefined1 *puVar13;
  uint8_t *puVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  int j_1;
  int l;
  long lVar19;
  float *pfVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  uint uVar24;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint uVar26;
  float fVar27;
  undefined1 auVar25 [16];
  float fVar28;
  uint uVar29;
  uint uVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  anon_union_4_2_5fd15f10 fp32;
  short sVar35;
  float fVar40;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  uint8_t Lm [16];
  uint8_t Ls [16];
  float sw [16];
  uint8_t Laux [16];
  float weight [16];
  float scales [16];
  float mins [16];
  uint8_t L [256];
  int in_stack_fffffffffffffd20;
  long local_2d0;
  long local_2c8;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  float local_248 [16];
  uint8_t local_208 [16];
  float local_1f8 [16];
  float local_1b8 [16];
  float local_178 [16];
  uint8_t local_138 [96];
  undefined1 local_d8 [168];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar36;
  undefined6 uVar37;
  
  sVar9 = ggml_row_size(GGML_TYPE_Q2_K,n_per_row);
  if (quant_weights == (float *)0x0) {
    quantize_row_q2_K_ref(src,(block_q2_K *)dst,n_per_row * nrow);
  }
  else if (0 < nrow) {
    local_2d0 = (long)dst + 0x10;
    local_2c8 = 0;
    do {
      if (0xff < (int)n_per_row) {
        uVar17 = 0;
        pfVar11 = quant_weights;
        lVar16 = local_2d0;
        pfVar18 = src;
        do {
          local_248[0xc] = 0.0;
          local_248[0xd] = 0.0;
          local_248[0xe] = 0.0;
          local_248[0xf] = 0.0;
          local_248[8] = 0.0;
          local_248[9] = 0.0;
          local_248[10] = 0.0;
          local_248[0xb] = 0.0;
          local_248[4] = 0.0;
          local_248[5] = 0.0;
          local_248[6] = 0.0;
          local_248[7] = 0.0;
          local_248[0] = 0.0;
          local_248[1] = 0.0;
          local_248[2] = 0.0;
          local_248[3] = 0.0;
          fVar28 = 0.0;
          lVar10 = 0;
          do {
            fVar28 = fVar28 + pfVar18[lVar10] * pfVar18[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x100);
          lVar10 = 0;
          pfVar12 = pfVar18;
          pfVar20 = pfVar11;
          do {
            lVar19 = 0;
            do {
              fVar23 = pfVar20[lVar19];
              fVar22 = pfVar12[lVar19] * pfVar12[lVar19] + fVar28 * 0.00390625;
              if (fVar22 < 0.0) {
                fVar22 = sqrtf(fVar22);
              }
              else {
                fVar22 = SQRT(fVar22);
              }
              local_1f8[lVar19] = fVar23 * fVar22;
              lVar19 = lVar19 + 1;
            } while (lVar19 != 0x10);
            fVar23 = local_248[lVar10];
            lVar19 = 0;
            do {
              fVar23 = fVar23 + local_1f8[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar19 != 0x10);
            local_248[lVar10] = fVar23;
            fVar23 = make_qkx3_quants(0x10,3,pfVar18 + lVar10 * 0x10,local_1f8,
                                      local_138 + lVar10 * 0x10,local_178 + lVar10,local_208,fVar23,
                                      fVar28 * 0.00390625,in_stack_fffffffffffffd20,SUB81(sVar9,0));
            local_1b8[lVar10] = fVar23;
            lVar10 = lVar10 + 1;
            pfVar12 = pfVar12 + 0x10;
            pfVar20 = pfVar20 + 0x10;
          } while (lVar10 != 0x10);
          fVar28 = make_qp_quants(0x10,0xf,local_1b8,local_258,local_248);
          fVar23 = make_qp_quants(0x10,0xf,local_178,local_268,local_248);
          uVar29 = (int)fVar28 * 2 ^ 0x80000000;
          uVar33 = (int)fVar23 * 2 ^ 0x80000000;
          uVar24 = -(uint)(-0xf000001 < (int)uVar29);
          uVar26 = -(uint)(-0xf000001 < (int)uVar33);
          fVar22 = (float)(~uVar24 & 0x40000000 | ((uint)fVar28 & 0x7f800000) + 0x7800000 & uVar24)
                   + ABS(fVar28) * 5.192297e+33 * 7.70372e-34;
          fVar27 = (float)(~uVar26 & 0x40000000 | ((uint)fVar23 & 0x7f800000) + 0x7800000 & uVar26)
                   + ABS(fVar23) * 5.192297e+33 * 7.70372e-34;
          auVar25._0_4_ = ((uint)fVar22 & 0xfff) + ((uint)fVar22 >> 0xd & 0x7c00);
          auVar25._4_4_ = ((uint)fVar27 & 0xfff) + ((uint)fVar27 >> 0xd & 0x7c00);
          auVar25._8_8_ = 0;
          auVar30._0_4_ = -(uint)(0x7f000000 < (int)uVar29);
          auVar30._4_4_ = -(uint)(0x7f000000 < (int)uVar33);
          auVar30._8_4_ = -(uint)(0 < (int)(extraout_XMM0_Db * 2 ^ 0x80000000));
          auVar30._12_4_ = -(uint)(0 < (int)(extraout_XMM0_Db_00 * 2 ^ 0x80000000));
          auVar32._0_4_ = (uint)fVar28 >> 0x10;
          auVar32._4_4_ = (uint)fVar23 >> 0x10;
          auVar32._8_4_ = extraout_XMM0_Db >> 0x10;
          auVar32._12_4_ = extraout_XMM0_Db_00 >> 0x10;
          lVar10 = uVar17 * 0x54;
          auVar31 = auVar30 & _DAT_0014e680 | auVar32 & _DAT_0014e660 | ~auVar30 & auVar25;
          auVar25 = pshuflw(auVar32 & _DAT_0014e660,auVar31,0xe8);
          *(int *)((long)dst + lVar10 + 0x50) = auVar25._0_4_;
          auVar25 = _DAT_0014e5d0;
          fVar28 = ggml_table_f32_f16[auVar31._0_4_];
          auVar32 = psllw(local_268,4);
          *(undefined1 (*) [16])((long)dst + lVar10) = auVar32 & _DAT_0014e5d0 | local_258;
          auVar30 = _DAT_0014e780;
          auVar32 = _DAT_0014e770;
          fVar23 = ggml_table_f32_f16[auVar31._4_4_];
          puVar14 = local_138;
          lVar19 = 0;
          pfVar12 = pfVar18;
          do {
            bVar1 = *(byte *)((long)dst + lVar19 + lVar10);
            auVar31._0_4_ = (float)(bVar1 & 0xf) * fVar28;
            if ((auVar31._0_4_ != 0.0) || (NAN(auVar31._0_4_))) {
              fVar22 = (float)(bVar1 >> 4) * fVar23;
              auVar31._4_4_ = auVar31._0_4_;
              auVar31._8_4_ = auVar31._0_4_;
              auVar31._12_4_ = auVar31._0_4_;
              lVar15 = 0;
              do {
                pfVar20 = pfVar12 + lVar15;
                auVar38._0_4_ = *pfVar20 + fVar22;
                auVar38._4_4_ = pfVar20[1] + fVar22;
                auVar38._8_4_ = pfVar20[2] + fVar22;
                auVar38._12_4_ = pfVar20[3] + fVar22;
                auVar38 = divps(auVar38,auVar31);
                fVar27 = auVar38._0_4_ + 12582912.0;
                fVar40 = auVar38._4_4_ + 12582912.0;
                auVar34._0_8_ = CONCAT44(fVar40,fVar27) & 0x7fffff007fffff;
                auVar34._8_4_ = (uint)(auVar38._8_4_ + 12582912.0) & 0x7fffff;
                auVar34._12_4_ = (uint)(auVar38._12_4_ + 12582912.0) & 0x7fffff;
                auVar41._0_4_ = -(uint)((int)((uint)fVar27 & 0x7fffff) < (int)DAT_0014e750);
                auVar41._4_4_ = -(uint)((int)((uint)fVar40 & 0x7fffff) < DAT_0014e750._4_4_);
                auVar41._8_4_ = -(uint)((int)auVar34._8_4_ < DAT_0014e750._8_4_);
                auVar41._12_4_ = -(uint)((int)auVar34._12_4_ < DAT_0014e750._12_4_);
                auVar38 = ~auVar41 & _DAT_0014e750 | auVar34 & auVar41;
                auVar39._0_4_ = -(uint)(0x400000 < auVar38._0_4_);
                auVar39._4_4_ = -(uint)(0x400000 < auVar38._4_4_);
                auVar39._8_4_ = -(uint)(0x400000 < auVar38._8_4_);
                auVar39._12_4_ = -(uint)(0x400000 < auVar38._12_4_);
                auVar38 = auVar39 & auVar38 & _DAT_0014e730;
                sVar6 = auVar38._0_2_;
                cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar38[0] - (0xff < sVar6);
                sVar6 = auVar38._2_2_;
                sVar35 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar38[2] - (0xff < sVar6),cVar2)
                ;
                sVar6 = auVar38._4_2_;
                cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar38[4] - (0xff < sVar6);
                sVar6 = auVar38._6_2_;
                uVar36 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar38[6] - (0xff < sVar6),
                                  CONCAT12(cVar3,sVar35));
                sVar6 = auVar38._8_2_;
                cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar38[8] - (0xff < sVar6);
                sVar6 = auVar38._10_2_;
                uVar37 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar38[10] - (0xff < sVar6),
                                  CONCAT14(cVar4,uVar36));
                sVar6 = auVar38._12_2_;
                cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar38[0xc] - (0xff < sVar6);
                sVar8 = auVar38._14_2_;
                sVar6 = (short)((uint)uVar36 >> 0x10);
                sVar7 = (short)((uint6)uVar37 >> 0x20);
                sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar38[0xe] -
                                         (0xff < sVar8),CONCAT16(cVar5,uVar37)) >> 0x30);
                *(uint *)(puVar14 + lVar15) =
                     CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                              CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                       CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 -
                                                (0xff < sVar6),
                                                (0 < sVar35) * (sVar35 < 0x100) * cVar2 -
                                                (0xff < sVar35))));
                lVar15 = lVar15 + 4;
              } while (lVar15 != 0x10);
            }
            lVar19 = lVar19 + 1;
            puVar14 = puVar14 + 0x10;
            pfVar12 = pfVar12 + 0x10;
          } while (lVar19 != 0x10);
          puVar13 = local_d8;
          lVar10 = lVar16;
          lVar19 = 0;
          do {
            lVar15 = 0;
            do {
              auVar31 = psllw(*(undefined1 (*) [16])(puVar13 + lVar15 + -0x40),2);
              auVar38 = psllw(*(undefined1 (*) [16])(puVar13 + lVar15 + -0x20),4);
              auVar34 = psllw(*(undefined1 (*) [16])(puVar13 + lVar15),6);
              *(undefined1 (*) [16])(lVar10 + lVar15) =
                   auVar34 & auVar30 | auVar38 & auVar25 |
                   auVar31 & auVar32 | *(undefined1 (*) [16])(puVar13 + lVar15 + -0x60);
              lVar15 = lVar15 + 0x10;
            } while (lVar15 != 0x20);
            puVar13 = puVar13 + 0x80;
            lVar10 = lVar10 + 0x20;
            bVar21 = lVar19 == 0;
            lVar19 = lVar19 + 0x80;
          } while (bVar21);
          pfVar18 = pfVar18 + 0x100;
          uVar17 = uVar17 + 1;
          pfVar11 = pfVar11 + 0x100;
          lVar16 = lVar16 + 0x54;
        } while (uVar17 != ((uint)((ulong)n_per_row >> 8) & 0x7fffff));
      }
      src = src + n_per_row;
      dst = (void *)((long)dst + sVar9);
      local_2c8 = local_2c8 + 1;
      local_2d0 = local_2d0 + sVar9;
    } while (local_2c8 != nrow);
  }
  return sVar9 * nrow;
}

Assistant:

size_t quantize_q2_K(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    size_t row_size = ggml_row_size(GGML_TYPE_Q2_K, n_per_row);
    if (!quant_weights) {
        quantize_row_q2_K_ref(src, dst, (int64_t)nrow*n_per_row);
    }
    else {
        char * qrow = (char *)dst;
        for (int64_t row = 0; row < nrow; ++row) {
            quantize_row_q2_K_impl(src, (block_q2_K*)qrow, n_per_row, quant_weights);
            src += n_per_row;
            qrow += row_size;
        }
    }
    return nrow * row_size;
}